

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

size_t pugi::impl::anon_unknown_0::convert_buffer_output
                 (char_t *param_1,uint8_t *r_u8,uint16_t *r_u16,uint32_t *r_u32,char_t *data,
                 size_t length,xml_encoding encoding)

{
  bool bVar1;
  xml_encoding xVar2;
  xml_encoding native_encoding_1;
  xml_encoding native_encoding;
  size_t length_local;
  char_t *data_local;
  uint32_t *r_u32_local;
  uint16_t *r_u16_local;
  uint8_t *r_u8_local;
  char_t *param_0_local;
  
  if ((encoding == encoding_utf16_be) || (encoding == encoding_utf16_le)) {
    bVar1 = is_little_endian();
    xVar2 = encoding_utf16_be;
    if (bVar1) {
      xVar2 = encoding_utf16_le;
    }
    param_0_local =
         (char_t *)
         (anonymous_namespace)::
         convert_buffer_output_generic<pugi::impl::(anonymous_namespace)::utf8_decoder,pugi::impl::(anonymous_namespace)::utf16_writer>
                   (r_u16,data,length,xVar2 != encoding);
  }
  else if ((encoding == encoding_utf32_be) || (encoding == encoding_utf32_le)) {
    bVar1 = is_little_endian();
    xVar2 = encoding_utf32_be;
    if (bVar1) {
      xVar2 = encoding_utf32_le;
    }
    param_0_local =
         (char_t *)
         (anonymous_namespace)::
         convert_buffer_output_generic<pugi::impl::(anonymous_namespace)::utf8_decoder,pugi::impl::(anonymous_namespace)::utf32_writer>
                   (r_u32,data,length,xVar2 != encoding);
  }
  else {
    if (encoding != encoding_latin1) {
      __assert_fail("false && \"Invalid encoding\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/dfranx[P]PluginShadertoy/libs/pugixml/src/pugixml.cpp"
                    ,0xe67,
                    "size_t pugi::impl::(anonymous namespace)::convert_buffer_output(char_t *, uint8_t *, uint16_t *, uint32_t *, const char_t *, size_t, xml_encoding)"
                   );
    }
    param_0_local =
         (char_t *)
         (anonymous_namespace)::
         convert_buffer_output_generic<pugi::impl::(anonymous_namespace)::utf8_decoder,pugi::impl::(anonymous_namespace)::latin1_writer>
                   (r_u8,data,length);
  }
  return (size_t)param_0_local;
}

Assistant:

PUGI__FN size_t convert_buffer_output(char_t* /* r_char */, uint8_t* r_u8, uint16_t* r_u16, uint32_t* r_u32, const char_t* data, size_t length, xml_encoding encoding)
	{
		if (encoding == encoding_utf16_be || encoding == encoding_utf16_le)
		{
			xml_encoding native_encoding = is_little_endian() ? encoding_utf16_le : encoding_utf16_be;

			return convert_buffer_output_generic(r_u16, data, length, utf8_decoder(), utf16_writer(), native_encoding != encoding);
		}

		if (encoding == encoding_utf32_be || encoding == encoding_utf32_le)
		{
			xml_encoding native_encoding = is_little_endian() ? encoding_utf32_le : encoding_utf32_be;

			return convert_buffer_output_generic(r_u32, data, length, utf8_decoder(), utf32_writer(), native_encoding != encoding);
		}

		if (encoding == encoding_latin1)
			return convert_buffer_output_generic(r_u8, data, length, utf8_decoder(), latin1_writer());

		assert(false && "Invalid encoding"); // unreachable
		return 0;
	}